

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Hashing.h
# Opt level: O3

void __thiscall llvm::hashing::detail::hash_state::mix(hash_state *this,char *s)

{
  ulong uVar1;
  ulong uVar2;
  uint64_t uVar3;
  
  uVar1 = this->h0 + this->h1 + this->h3 + *(long *)(s + 8);
  uVar1 = (uVar1 * 0x8000000 | uVar1 >> 0x25) * -0x4b6d499041670d8d;
  this->h0 = uVar1;
  uVar2 = this->h1 + this->h4 + *(long *)(s + 0x30);
  uVar3 = (uVar2 * 0x400000 | uVar2 >> 0x2a) * -0x4b6d499041670d8d;
  this->h1 = uVar3;
  uVar1 = uVar1 ^ this->h6;
  this->h0 = uVar1;
  this->h1 = uVar3 + this->h3 + *(long *)(s + 0x28);
  uVar2 = this->h2 + this->h5;
  this->h2 = (uVar2 * 0x80000000 | uVar2 >> 0x21) * -0x4b6d499041670d8d;
  this->h3 = this->h4 * -0x4b6d499041670d8d;
  this->h4 = uVar1 + this->h5;
  mix_32_bytes(s,&this->h3,&this->h4);
  this->h5 = this->h6 + this->h2;
  this->h6 = *(long *)(s + 0x10) + this->h1;
  mix_32_bytes(s + 0x20,&this->h5,&this->h6);
  uVar3 = this->h2;
  this->h2 = this->h0;
  this->h0 = uVar3;
  return;
}

Assistant:

void mix(const char *s) {
    h0 = rotate(h0 + h1 + h3 + fetch64(s + 8), 37) * k1;
    h1 = rotate(h1 + h4 + fetch64(s + 48), 42) * k1;
    h0 ^= h6;
    h1 += h3 + fetch64(s + 40);
    h2 = rotate(h2 + h5, 33) * k1;
    h3 = h4 * k1;
    h4 = h0 + h5;
    mix_32_bytes(s, h3, h4);
    h5 = h2 + h6;
    h6 = h1 + fetch64(s + 16);
    mix_32_bytes(s + 32, h5, h6);
    std::swap(h2, h0);
  }